

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDComponentPtrPair __thiscall ON_SubDVertex::BoundaryEdgePair(ON_SubDVertex *this)

{
  bool bVar1;
  ON_SubDComponentPtr OVar2;
  ON_SubDComponentPtr OVar3;
  ulong uVar4;
  ON_SubDComponentPtr OVar5;
  ulong uVar6;
  ON_SubDEdge *this_00;
  uint uVar7;
  ON_SubDComponentPtrPair OVar8;
  ON__UINT_PTR local_38;
  
  local_38 = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
  OVar5.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
  if ((this->m_edges != (ON_SubDEdgePtr *)0x0) && (1 < this->m_edge_count)) {
    uVar6 = 0;
    do {
      uVar4 = this->m_edges[uVar6].m_ptr;
      this_00 = (ON_SubDEdge *)(uVar4 & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) &&
         (bVar1 = ON_SubDEdge::HasBoundaryEdgeTopology(this_00), bVar1)) {
        uVar7 = (uint)uVar4 & 1;
        if (this_00->m_vertex[uVar7] != this) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                     ,0x16fd,"","m_edges[vei] has incorrect edge orientation flag.");
          OVar2 = ON_SubDComponentPtrPair::Null.m_pair[0];
          OVar3 = ON_SubDComponentPtrPair::Null.m_pair[1];
          if (this_00->m_vertex[uVar7 ^ 1] != this) goto LAB_005ca5e4;
          uVar4 = uVar4 & 0xfffffffffffffff9 ^ 1;
        }
        if (OVar5.m_ptr < 8 || (OVar5.m_ptr & 6) == 0) {
          if (uVar4 < 8) {
            OVar5 = (ON_SubDComponentPtr)0;
          }
          else {
            OVar5.m_ptr = uVar4 & 0xfffffffffffffff9 | 4;
          }
        }
        else {
          OVar2.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
          OVar3.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
          if (7 < local_38 && (local_38 & 6) != 0) goto LAB_005ca5e4;
          if (uVar4 < 8) {
            local_38 = 0;
          }
          else {
            local_38 = uVar4 & 0xfffffffffffffff9 | 4;
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->m_edge_count);
  }
  OVar2.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
  OVar3.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
  if (7 < local_38 && (local_38 & 6) != 0) {
    OVar2.m_ptr = OVar5.m_ptr;
    OVar3.m_ptr = local_38;
  }
LAB_005ca5e4:
  OVar8.m_pair[1].m_ptr = OVar3.m_ptr;
  OVar8.m_pair[0].m_ptr = OVar2.m_ptr;
  return (ON_SubDComponentPtrPair)OVar8.m_pair;
}

Assistant:

const ON_SubDComponentPtrPair ON_SubDVertex::BoundaryEdgePair() const
{
  ON_SubDComponentPtrPair epair = ON_SubDComponentPtrPair::Null;
  if (nullptr != m_edges && m_edge_count >= 2)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      ON_SubDEdgePtr eptr = m_edges[vei];
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr.m_ptr);
      if (nullptr == e)
        continue;
      if (false == e->HasBoundaryEdgeTopology())
        continue;
      const ON__UINT_PTR edir = ON_SUBD_EDGE_DIRECTION(eptr.m_ptr);
      if (this != e->m_vertex[edir])
      {
        // m_edges[vei] is corrupt ...
        ON_SUBD_ERROR("m_edges[vei] has incorrect edge orientation flag.");
        if (this == e->m_vertex[1 - edir])
          eptr = eptr.Reversed(); // we can still return the requested information.
        else
          return ON_SubDComponentPtrPair::Null;
      }
      if (epair.m_pair[0].IsNull())
        epair.m_pair[0] = ON_SubDComponentPtr::Create(eptr);
      else if (epair.m_pair[1].IsNull())
        epair.m_pair[1] = ON_SubDComponentPtr::Create(eptr);
      else
        return ON_SubDComponentPtrPair::Null; // 3 or more boundary edges
    }
  }
  return (epair.m_pair[1].IsNotNull()) ? epair : ON_SubDComponentPtrPair::Null;
}